

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

bool __thiscall
CTypeCheckerVisitor::checkVariableVisibility
          (CTypeCheckerVisitor *this,string *variableName,shared_ptr<ClassInfo> *classInfo,
          shared_ptr<MethodInfo> *methodInfo)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>
  methodFields;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>
  classVariables;
  __alloc_node_gen_t __alloc_node_gen_1;
  shared_ptr<ClassInfo> local_d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>_>_>
  local_50;
  shared_ptr<MethodInfo> local_48;
  
  peVar1 = (methodInfo->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_0012081f:
    peVar2 = (((classInfo->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88._M_buckets = (__buckets_ptr)0x0;
    local_88._M_bucket_count = (peVar2->variables)._M_h._M_bucket_count;
    local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88._M_element_count = (peVar2->variables)._M_h._M_element_count;
    local_88._M_rehash_policy._M_max_load_factor =
         (peVar2->variables)._M_h._M_rehash_policy._M_max_load_factor;
    local_88._M_rehash_policy._4_4_ =
         *(undefined4 *)&(peVar2->variables)._M_h._M_rehash_policy.field_0x4;
    local_88._M_rehash_policy._M_next_resize =
         *(size_t *)((long)&(peVar2->variables)._M_h._M_rehash_policy + 8);
    local_88._M_single_bucket = (__node_base_ptr)0x0;
    local_c0._M_buckets = (__buckets_ptr)&local_88;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_88,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)peVar2,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>_>_>
                *)&local_c0);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_88,variableName);
    bVar3 = true;
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)&((this->currentClass).
                                   super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                  ->baseClass);
      if (iVar4 == 0) {
        bVar3 = false;
      }
      else {
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)(this->table).
                                 super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &((classInfo->
                                super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                               baseClass);
        local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pmVar6->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (pmVar6->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_48.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar3 = checkVariableVisibility(this,variableName,&local_d0,&local_48);
        if (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_88);
  }
  else {
    peVar2 = (peVar1->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_88._M_buckets = (__buckets_ptr)0x0;
    local_88._M_bucket_count = (peVar2->variables)._M_h._M_bucket_count;
    local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88._M_element_count = (peVar2->variables)._M_h._M_element_count;
    local_88._M_rehash_policy._M_max_load_factor =
         (peVar2->variables)._M_h._M_rehash_policy._M_max_load_factor;
    local_88._M_rehash_policy._4_4_ =
         *(undefined4 *)&(peVar2->variables)._M_h._M_rehash_policy.field_0x4;
    local_88._M_rehash_policy._M_next_resize =
         *(size_t *)((long)&(peVar2->variables)._M_h._M_rehash_policy + 8);
    local_88._M_single_bucket = (__node_base_ptr)0x0;
    local_c0._M_buckets = (__buckets_ptr)&local_88;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_88,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)peVar2,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>_>_>
                *)&local_c0);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_88,variableName);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      peVar2 = (((methodInfo->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c0._M_buckets = (__buckets_ptr)0x0;
      local_c0._M_bucket_count = (peVar2->variables)._M_h._M_bucket_count;
      local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c0._M_element_count = (peVar2->variables)._M_h._M_element_count;
      local_c0._M_rehash_policy._M_max_load_factor =
           (peVar2->variables)._M_h._M_rehash_policy._M_max_load_factor;
      local_c0._M_rehash_policy._4_4_ =
           *(undefined4 *)&(peVar2->variables)._M_h._M_rehash_policy.field_0x4;
      local_c0._M_rehash_policy._M_next_resize =
           *(size_t *)((long)&(peVar2->variables)._M_h._M_rehash_policy + 8);
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      local_50._M_h = (__hashtable_alloc *)&local_c0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<VariableInfo>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_c0,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)peVar2,&local_50);
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_c0,variableName);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_c0);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_88);
        goto LAB_0012081f;
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_88);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CTypeCheckerVisitor::checkVariableVisibility( const std::string& variableName, std::shared_ptr<ClassInfo> classInfo,
std::shared_ptr<MethodInfo> methodInfo ) {
    //Nullptr for method info means that we try to find the variable in fields of base classes.
    if( methodInfo ) {
        auto methodVariables = methodInfo->arguments->variables;
        if (methodVariables.find(variableName) != methodVariables.end()) {
            return true;
        }
        auto methodFields = methodInfo->fields->variables;
        if (methodFields.find(variableName) != methodFields.end()) {
            return true;
        }
    }
    auto classVariables = classInfo->fields->variables;
    if( classVariables.find( variableName ) == classVariables.end() ) {
        if ( currentClass->baseClass != "" ) {
            return checkVariableVisibility( variableName, table->classes[classInfo->baseClass], nullptr );
        } else {
            return false;
        }
    } else {
        return true;
    }
}